

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

uint32_t spvtools::val::anon_unknown_0::getBaseAlignment
                   (uint32_t member_id,bool roundUp,LayoutConstraints *inherited,
                   MemberConstraints *constraints,ValidationState_t *vstate)

{
  uint16_t uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  uint32_t uVar5;
  Instruction *pIVar6;
  ulong uVar7;
  mapped_type *inherited_00;
  uint uVar8;
  ulong uVar9;
  key_type kVar10;
  int iVar11;
  uint32_t uVar12;
  key_type local_50;
  void *local_48;
  long lStack_40;
  long local_38;
  
  kVar10.second = 0;
  kVar10.first = member_id;
  iVar11 = 1;
  while( true ) {
    pIVar6 = ValidationState_t::FindDef(vstate,kVar10.first);
    uVar1 = (pIVar6->inst_).opcode;
    if (uVar1 != 0x17) break;
    puVar2 = (pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = puVar2[3];
    uVar8 = 4;
    if (uVar4 != 3) {
      uVar8 = uVar4;
    }
    kVar10.second = 0;
    kVar10.first = puVar2[2];
    iVar11 = iVar11 * uVar8;
  }
  switch(uVar1) {
  case 0x15:
  case 0x16:
    uVar4 = (pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
    break;
  case 0x17:
  case 0x1f:
switchD_001d6f17_caseD_17:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0xe7,
                  "uint32_t spvtools::val::(anonymous namespace)::getBaseAlignment(uint32_t, bool, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                 );
  case 0x18:
    puVar2 = (pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = puVar2[2];
    if (inherited->majorness == kColumnMajor) goto LAB_001d6f56;
    uVar8 = puVar2[3];
    pIVar6 = ValidationState_t::FindDef(vstate,uVar4);
    uVar5 = getBaseAlignment((pIVar6->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[2],roundUp,inherited,constraints,
                             vstate);
    uVar4 = 4;
    if (uVar8 != 3) {
      uVar4 = uVar8;
    }
    uVar5 = uVar4 * uVar5;
    goto LAB_001d6f66;
  case 0x19:
  case 0x1a:
  case 0x1b:
    bVar3 = EnumSet<spv::Capability>::contains(&vstate->module_capabilities_,BindlessTextureNV);
    if (!bVar3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                    ,0xad,
                    "uint32_t spvtools::val::(anonymous namespace)::getBaseAlignment(uint32_t, bool, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                   );
    }
    uVar4 = ValidationState_t::samplerimage_variable_address_mode(vstate);
    break;
  case 0x1c:
  case 0x1d:
    uVar4 = (pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
LAB_001d6f56:
    uVar5 = getBaseAlignment(uVar4,roundUp,inherited,constraints,vstate);
LAB_001d6f66:
    if (roundUp) {
      uVar5 = uVar5 + 0xf & 0xfffffff0;
    }
    goto LAB_001d70d7;
  case 0x1e:
    pIVar6 = ValidationState_t::FindDef(vstate,kVar10.first);
    local_48 = (void *)0x0;
    lStack_40 = 0;
    local_38 = 0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
               (pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 2,
               (pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    uVar7 = (ulong)(lStack_40 - (long)local_48) >> 2;
    if ((int)uVar7 == 0) {
      uVar12 = 1;
    }
    else {
      uVar12 = 1;
      uVar9 = 0;
      do {
        uVar5 = *(uint32_t *)((long)local_48 + uVar9 * 4);
        local_50 = kVar10;
        inherited_00 = std::
                       unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                       ::operator[](constraints,&local_50);
        uVar5 = getBaseAlignment(uVar5,roundUp,inherited_00,constraints,vstate);
        if (uVar5 < uVar12) {
          uVar5 = uVar12;
        }
        uVar12 = uVar5;
        uVar9 = uVar9 + 1;
        kVar10 = (key_type)((long)kVar10 + 0x100000000);
      } while ((uVar7 & 0xffffffff) != uVar9);
    }
    uVar5 = uVar12 + 0xf & 0xfffffff0;
    if (!roundUp) {
      uVar5 = uVar12;
    }
    if (local_48 != (void *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
    goto LAB_001d70d7;
  case 0x20:
    goto switchD_001d6f17_caseD_20;
  default:
    if (uVar1 != 0x1141) goto switchD_001d6f17_caseD_17;
    goto switchD_001d6f17_caseD_20;
  }
  uVar5 = uVar4 >> 3;
LAB_001d70d7:
  return uVar5 * iVar11;
switchD_001d6f17_caseD_20:
  uVar5 = vstate->pointer_size_and_alignment_;
  goto LAB_001d70d7;
}

Assistant:

uint32_t getBaseAlignment(uint32_t member_id, bool roundUp,
                          const LayoutConstraints& inherited,
                          MemberConstraints& constraints,
                          ValidationState_t& vstate) {
  const auto inst = vstate.FindDef(member_id);
  const auto& words = inst->words();
  // Minimal alignment is byte-aligned.
  uint32_t baseAlignment = 1;
  switch (inst->opcode()) {
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
      if (vstate.HasCapability(spv::Capability::BindlessTextureNV))
        return baseAlignment = vstate.samplerimage_variable_address_mode() / 8;
      assert(0);
      return 0;
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      baseAlignment = words[2] / 8;
      break;
    case spv::Op::OpTypeVector: {
      const auto componentId = words[2];
      const auto numComponents = words[3];
      const auto componentAlignment = getBaseAlignment(
          componentId, roundUp, inherited, constraints, vstate);
      baseAlignment =
          componentAlignment * (numComponents == 3 ? 4 : numComponents);
      break;
    }
    case spv::Op::OpTypeMatrix: {
      const auto column_type = words[2];
      if (inherited.majorness == kColumnMajor) {
        baseAlignment = getBaseAlignment(column_type, roundUp, inherited,
                                         constraints, vstate);
      } else {
        // A row-major matrix of C columns has a base alignment equal to the
        // base alignment of a vector of C matrix components.
        const auto num_columns = words[3];
        const auto component_inst = vstate.FindDef(column_type);
        const auto component_id = component_inst->words()[2];
        const auto componentAlignment = getBaseAlignment(
            component_id, roundUp, inherited, constraints, vstate);
        baseAlignment =
            componentAlignment * (num_columns == 3 ? 4 : num_columns);
      }
      if (roundUp) baseAlignment = align(baseAlignment, 16u);
    } break;
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      baseAlignment =
          getBaseAlignment(words[2], roundUp, inherited, constraints, vstate);
      if (roundUp) baseAlignment = align(baseAlignment, 16u);
      break;
    case spv::Op::OpTypeStruct: {
      const auto members = getStructMembers(member_id, vstate);
      for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
           memberIdx < numMembers; ++memberIdx) {
        const auto id = members[memberIdx];
        const auto& constraint =
            constraints[std::make_pair(member_id, memberIdx)];
        baseAlignment = std::max(
            baseAlignment,
            getBaseAlignment(id, roundUp, constraint, constraints, vstate));
      }
      if (roundUp) baseAlignment = align(baseAlignment, 16u);
      break;
    }
    case spv::Op::OpTypePointer:
    case spv::Op::OpTypeUntypedPointerKHR:
      baseAlignment = vstate.pointer_size_and_alignment();
      break;
    default:
      assert(0);
      break;
  }

  return baseAlignment;
}